

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.h
# Opt level: O0

void __thiscall
Test::Suite::TestMethod::TestMethod(TestMethod *this,string *methodName,SimpleTestMethod method)

{
  allocator<char> local_49;
  initializer_list<char> local_48;
  SimpleTestMethod local_38;
  SimpleTestMethod method_local;
  string *local_28;
  string *methodName_local;
  TestMethod *this_local;
  
  local_38 = method;
  local_28 = methodName;
  methodName_local = &this->name;
  this_local = (TestMethod *)method;
  std::__cxx11::string::string((string *)this,methodName);
  std::function<void(Test::Suite*)>::function<void(Test::Suite::*&)(),void>
            ((function<void(Test::Suite*)> *)&this->functor,&local_38);
  std::initializer_list<char>::initializer_list(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->argString,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

TestMethod(const std::string &methodName, SimpleTestMethod method) : name(methodName), functor(method), argString({}) {}